

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O1

int __thiscall CVmFuncPtr::get_fnptr(CVmFuncPtr *this,vm_val_t *v)

{
  uchar *p;
  vm_obj_id_t vVar1;
  size_t *psVar2;
  int iVar3;
  ulong uVar4;
  uchar *in_R11;
  bool bVar5;
  bool bVar6;
  
  p = this->p_;
  bVar5 = G_code_pool_X.super_CVmPoolPaged.page_slots_ != 0;
  if (bVar5) {
    psVar2 = &(G_code_pool_X.super_CVmPoolPaged.pages_)->siz;
    iVar3 = -(int)p;
    bVar5 = true;
    uVar4 = 1;
    do {
      in_R11 = (uchar *)((CVmPool_pg *)(psVar2 + -1))->mem;
      if ((in_R11 <= p) && (p < in_R11 + *psVar2)) {
        in_R11 = (uchar *)(ulong)(uint)-((int)in_R11 + iVar3);
        break;
      }
      bVar5 = uVar4 < G_code_pool_X.super_CVmPoolPaged.page_slots_;
      psVar2 = psVar2 + 2;
      iVar3 = iVar3 - G_code_pool_X.super_CVmPoolPaged._8_4_;
      bVar6 = uVar4 != G_code_pool_X.super_CVmPoolPaged.page_slots_;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  if (bVar5) {
    v->typ = VM_FUNCPTR;
    (v->val).obj = (vm_obj_id_t)in_R11;
  }
  else {
    vVar1 = CVmDynamicFunc::get_obj_from_prefix(p);
    if (vVar1 == 0) {
      v->typ = VM_NIL;
      return 0;
    }
    v->typ = VM_OBJ;
    (v->val).obj = vVar1;
  }
  return 1;
}

Assistant:

int CVmFuncPtr::get_fnptr(VMG_ vm_val_t *v)
{
    /* 
     *   Try translating the method address to a code pool offset.  If that
     *   succeeds, it's a regular static function.  
     */
    pool_ofs_t entry_ofs;
    if (G_code_pool->get_ofs((const char *)p_, &entry_ofs))
    {
        /* it's a regular function call */
        v->set_fnptr(entry_ofs);
        return TRUE;
    }

    /* 
     *   It's not a static function pointer, so it must be a dynamic
     *   function.  A DynamicFunc stores a prefix header before the start of
     *   our method header, containing the DynamicFunc object ID.  Read the
     *   object ID, and return it as a VM_OBJ value.  
     */
    vm_obj_id_t obj = CVmDynamicFunc::get_obj_from_prefix(vmg_ p_);
    if (obj != VM_INVALID_OBJ)
    {
        v->set_obj(obj);
        return TRUE;
    }

    /* we couldn't find any valid object */
    v->set_nil();
    return FALSE;
}